

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator * __thiscall
QMultiHash<QString,QDomNodePrivate*>::emplace<QDomNodePrivate*const&>
          (iterator *__return_storage_ptr__,void *this,QString *key,QDomNodePrivate **args)

{
  Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *pDVar1;
  QDomNodePrivate *pQVar2;
  long in_FS_OFFSET;
  QMultiHash<QString,_QDomNodePrivate_*> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *this;
  if (pQVar2 == (QDomNodePrivate *)0x0) {
    local_38.d = (Data *)0x0;
    local_38.m_size = *(qsizetype *)((long)this + 8);
LAB_0011b402:
    pQVar2 = (QDomNodePrivate *)0x0;
LAB_0011b42e:
    pDVar1 = QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_>::detached
                       ((Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)pQVar2);
    *(Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> **)this = pDVar1;
LAB_0011b437:
    emplace_helper<QDomNodePrivate*const&>(__return_storage_ptr__,this,key,args);
    QMultiHash<QString,_QDomNodePrivate_*>::~QMultiHash(&local_38);
  }
  else {
    if (1 < *(uint *)&pQVar2->_vptr_QDomNodePrivate) {
      local_38.m_size = *(qsizetype *)((long)this + 8);
      local_38.d = (Data *)pQVar2;
      if (*(int *)&pQVar2->_vptr_QDomNodePrivate != -1) {
        LOCK();
        *(int *)&pQVar2->_vptr_QDomNodePrivate = *(int *)&pQVar2->_vptr_QDomNodePrivate + 1;
        UNLOCK();
        pQVar2 = *this;
        if (pQVar2 == (QDomNodePrivate *)0x0) goto LAB_0011b402;
      }
      if (1 < *(uint *)&pQVar2->_vptr_QDomNodePrivate) goto LAB_0011b42e;
      goto LAB_0011b437;
    }
    if (*(ulong *)&pQVar2->ref < (ulong)pQVar2->prev >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        emplace_helper<QDomNodePrivate*const&>(__return_storage_ptr__,this,key,args);
        return __return_storage_ptr__;
      }
      goto LAB_0011b488;
    }
    local_38.d = (Data *)*args;
    emplace_helper<QDomNodePrivate*>(__return_storage_ptr__,this,key,(QDomNodePrivate **)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_0011b488:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }